

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O2

string * WrapWithGuard(string *__return_storage_ptr__,string *output_file,string *header_entries)

{
  _Alloc_hider _Var1;
  char cVar2;
  int iVar3;
  size_type i;
  ulong uVar4;
  string guard;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_a8,"TPL_",(allocator *)&local_88);
  std::operator+(&local_48,&local_a8,output_file);
  std::__cxx11::string::~string((string *)&local_a8);
  for (uVar4 = 0; _Var1._M_p = local_48._M_dataplus._M_p, uVar4 < local_48._M_string_length;
      uVar4 = uVar4 + 1) {
    cVar2 = local_48._M_dataplus._M_p[uVar4];
    iVar3 = isalnum((int)cVar2);
    if (iVar3 == 0) {
      cVar2 = '_';
    }
    else {
      iVar3 = toupper((int)cVar2);
      cVar2 = (char)iVar3;
    }
    _Var1._M_p[uVar4] = cVar2;
  }
  std::__cxx11::string::append((char *)&local_48);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_68,"#ifndef ",&local_a9);
  std::operator+(&local_88,&local_68,&local_48);
  std::operator+(&local_a8,&local_88,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"#define ",&local_a9);
  std::operator+(&local_88,&local_68,&local_48);
  std::operator+(&local_a8,&local_88,"\n\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_68,"\n#endif  // ",&local_a9);
  std::operator+(&local_88,&local_68,&local_48);
  std::operator+(&local_a8,&local_88,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static string WrapWithGuard(const string& output_file,
                            const string& header_entries) {
  string guard(string("TPL_") + output_file);
  ConvertToIdentifier(&guard);
  guard.append("_H_");

  string out;
  out.append(string("#ifndef ") + guard + "\n");
  out.append(string("#define ") + guard + "\n\n");

  // Now append the header-entry info to the intro above
  out.append(header_entries);

  out.append(string("\n#endif  // ") + guard + "\n");
  return out;
}